

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O0

void __thiscall
mp::ArrayRef<int>::init_from_rvalue<mp::ArrayRef<int>>(ArrayRef<int> *this,ArrayRef<int> *other)

{
  size_type sVar1;
  int *piVar2;
  pointer piVar3;
  ArrayRef<int> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  vector<int,_std::allocator<int>_> *__x;
  
  __x = in_RDI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&in_RSI->save_);
  if (sVar1 == 0) {
    piVar2 = data(in_RSI);
    in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar2;
    piVar3 = (pointer)size(in_RSI);
    in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator=(unaff_retaddr,__x);
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x44b9ae);
    in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar2;
    piVar3 = (pointer)std::vector<int,_std::allocator<int>_>::size(in_RDI);
    in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }